

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

string_t duckdb::StringVector::AddStringOrBlob(Vector *vector,string_t data)

{
  string_t data_00;
  bool bVar1;
  VectorStringBuffer *this;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  VectorStringBuffer *string_buffer;
  Vector *in_stack_00000040;
  undefined1 local_10 [16];
  
  bVar1 = string_t::IsInlined((string_t *)0x3ddd9d);
  if (bVar1) {
    local_10._8_8_ = in_RDX;
    local_10._0_8_ = in_RSI;
  }
  else {
    this = GetStringBuffer(in_stack_00000040);
    data_00.value.pointer.ptr = (char *)in_RSI;
    data_00.value._0_8_ = in_RDI;
    local_10 = (undefined1  [16])VectorStringBuffer::AddBlob(this,data_00);
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_10;
}

Assistant:

string_t StringVector::AddStringOrBlob(Vector &vector, string_t data) {
	D_ASSERT(vector.GetType().InternalType() == PhysicalType::VARCHAR);
	if (data.IsInlined()) {
		// string will be inlined: no need to store in string heap
		return data;
	}
	auto &string_buffer = GetStringBuffer(vector);
	return string_buffer.AddBlob(data);
}